

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEAngle.cpp
# Opt level: O3

bool __thiscall test_CEAngle::test_setangle(test_CEAngle *this)

{
  undefined1 uVar1;
  char *pcVar2;
  initializer_list<double> __l;
  CEAngle test_ang;
  string angle_dms_str1;
  string angle_hms_str1;
  string angle_hms_str3;
  string angle_hms_str2;
  string angle_deg_str;
  double angle_deg;
  double angle_rad;
  undefined4 local_12c;
  ulong local_128;
  allocator local_119;
  double local_118 [4];
  CEAngle local_f8;
  vector<double,_std::allocator<double>_> local_e8;
  CEAngleType local_d0 [8];
  double local_b0 [4];
  undefined8 local_90 [4];
  double local_70 [4];
  CEAngleType local_50 [8];
  double local_30;
  double local_28;
  
  CEAngle::CEAngle(&local_f8);
  local_28 = 1.5707963267948966;
  local_50[0] = RADIANS;
  CEAngle::SetAngle(&local_f8,&local_28,local_50);
  local_b0[0] = CEAngle::operator_cast_to_double(&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"test_setangle",(allocator *)local_90);
  local_70[0] = (double)CONCAT44(local_70[0]._4_4_,0x6f);
  (**(code **)(*(long *)this + 0x58))(this,local_b0,&local_28,local_50);
  std::__cxx11::string::~string((string *)local_50);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_90);
  local_30 = 180.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"180.0",(allocator *)local_b0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_b0);
  local_b0[0] = (double)((ulong)local_b0[0] & 0xffffffff00000000);
  CEAngle::SetAngle(&local_f8,&local_30,(CEAngleType *)local_b0);
  local_70[0] = CEAngle::operator_cast_to_double(&local_f8);
  local_90[0] = 0x400921fb54442d18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,"test_setangle",(allocator *)local_118);
  local_d0[0] = 0x75;
  (**(code **)(*(long *)this + 0x58))(this,local_70,local_90,local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_118);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_b0[0] = (double)((ulong)local_b0[0] & 0xffffffff00000000);
  local_70[0] = (double)((ulong)local_70[0] & 0xffffffffffffff00);
  CEAngle::SetAngle(&local_f8,pcVar2,(CEAngleType *)local_b0,(char *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,"3:0:0",(allocator *)local_70);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_70,"6 0 0",(allocator *)local_90);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_90,"9.0.0",(allocator *)local_d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_d0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_d0[0] = HMS;
  local_118[0] = (double)((ulong)local_118[0] & 0xffffffffffffff00);
  CEAngle::SetAngle(&local_f8,pcVar2,local_d0,(char *)local_118);
  local_118[0] = CEAngle::operator_cast_to_double(&local_f8);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fe921fb54442d18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_d0,"test_setangle",(allocator *)&local_12c);
  local_128._0_4_ = 0x7d;
  (**(code **)(*(long *)this + 0x58))(this,local_118,&local_e8,local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_12c);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_d0[0] = HMS;
  local_118[0] = (double)((ulong)local_118[0] & 0xffffffffffffff00);
  CEAngle::SetAngle(&local_f8,pcVar2,local_d0,(char *)local_118);
  local_118[0] = CEAngle::operator_cast_to_double(&local_f8);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff921fb54442d18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_d0,"test_setangle",(allocator *)&local_12c);
  local_128._0_4_ = 0x7f;
  (**(code **)(*(long *)this + 0x58))(this,local_118,&local_e8,local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_12c);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_d0[0] = HMS;
  local_118[0] = (double)CONCAT71(local_118[0]._1_7_,0x2e);
  CEAngle::SetAngle(&local_f8,pcVar2,local_d0,(char *)local_118);
  local_118[0] = CEAngle::operator_cast_to_double(&local_f8);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x4002d97c7f3321d2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_d0,"test_setangle",(allocator *)&local_12c);
  local_128 = CONCAT44(local_128._4_4_,0x81);
  (**(code **)(*(long *)this + 0x58))(this,local_118,&local_e8,local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_12c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_d0,"45:0:0",(allocator *)local_118);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_118);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_118[0]._0_4_ = 3;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffffffffff00);
  CEAngle::SetAngle(&local_f8,pcVar2,(CEAngleType *)local_118,(char *)&local_e8);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEAngle::operator_cast_to_double(&local_f8);
  local_128 = 0x3fe921fb54442d18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_118,"test_setangle",&local_119);
  local_12c = 0x86;
  (**(code **)(*(long *)this + 0x58))(this,&local_e8,&local_128,local_118);
  std::__cxx11::string::~string((string *)local_118);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_119);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_118[0] = (double)CONCAT44(local_118[0]._4_4_,2);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,0x20);
  CEAngle::SetAngle(&local_f8,pcVar2,(CEAngleType *)local_118,(char *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_118,"test_setangle",(allocator *)&local_128);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x8b;
  (**(code **)(*(long *)this + 0x48))(this,0,local_118);
  std::__cxx11::string::~string((string *)local_118);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_128);
  local_118[0] = 123.456;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 2;
  CEAngle::SetAngle(&local_f8,local_118,(CEAngleType *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_118,"test_setangle",(allocator *)&local_128);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x93;
  (**(code **)(*(long *)this + 0x48))(this,0,local_118);
  std::__cxx11::string::~string((string *)local_118);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_128);
  local_118[2] = 6.0;
  local_118[3] = 0.789;
  local_118[0] = 123.0;
  local_118[1] = 45.0;
  std::allocator<double>::allocator((allocator<double> *)&local_12c);
  __l._M_len = 4;
  __l._M_array = local_118;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_e8,__l,(allocator<double> *)&local_12c);
  local_128 = local_128 & 0xffffffff00000000;
  CEAngle::SetAngle(&local_f8,&local_e8,(CEAngleType *)&local_128);
  std::vector<double,_std::allocator<double>_>::~vector(&local_e8);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_12c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_118,"test_setangle",(allocator *)&local_128);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0x9b);
  (**(code **)(*(long *)this + 0x48))(this,0,local_118);
  std::__cxx11::string::~string((string *)local_118);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_128);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_50);
  CEAngle::~CEAngle(&local_f8);
  return (bool)uVar1;
}

Assistant:

bool test_CEAngle::test_setangle(void)
{
    // Construct the test angle
    CEAngle test_ang;
    // Test radians
    double angle_rad = M_PI_2;  // PI/2 radians or 90 degrees
    test_ang.SetAngle(angle_rad, CEAngleType::RADIANS);
    test_double(test_ang, angle_rad, __func__, __LINE__);

    // Test degrees
    double angle_deg = 180.0;
    std::string angle_deg_str = "180.0";
    test_ang.SetAngle(angle_deg, CEAngleType::DEGREES);
    test_double(test_ang, M_PI, __func__, __LINE__);
    test_ang.SetAngle(angle_deg_str.c_str(), CEAngleType::DEGREES);

    // HMS values to be tested
    std::string angle_hms_str1 = "3:0:0";
    std::string angle_hms_str2 = "6 0 0";
    std::string angle_hms_str3 = "9.0.0";
    test_ang.SetAngle(angle_hms_str1.c_str(), CEAngleType::HMS);
    test_double(test_ang, M_PI_2/2.0, __func__, __LINE__);
    test_ang.SetAngle(angle_hms_str2.c_str(), CEAngleType::HMS);
    test_double(test_ang, M_PI_2, __func__, __LINE__);
    test_ang.SetAngle(angle_hms_str3.c_str(), CEAngleType::HMS, '.');
    test_double(test_ang, 1.5 * M_PI_2, __func__, __LINE__);

    // DMS values to be tested
    std::string angle_dms_str1 = "45:0:0";
    test_ang.SetAngle(angle_dms_str1.c_str(), CEAngleType::DMS);
    test_double(test_ang, M_PI_2/2.0, __func__, __LINE__);

    // Try to set the angle by passing the wrong delimiter
    try {
        test_ang.SetAngle(angle_hms_str1.c_str(), CEAngleType::HMS, ' ');
        test(false, __func__, __LINE__);
    } catch (CEException::invalid_delimiter& e) {
        test(true, __func__, __LINE__);
    }

    // Try to set angle as a double, but with the wrong CEAngleType
    try {
        test_ang.SetAngle(123.456, CEAngleType::HMS);
        test(false, __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, __func__, __LINE__);
    }

    // Try to set the angle from a vector<double> with wrong CEAngleType
    try {
        test_ang.SetAngle({123,45,6, 0.789}, CEAngleType::DEGREES);
        test(false, __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, __func__, __LINE__);
    }

    return pass();
}